

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bias.cpp
# Opt level: O0

int __thiscall ncnn::Bias::load_model(Bias *this,ModelBin *mb)

{
  bool bVar1;
  long *in_RSI;
  long in_RDI;
  Mat *m;
  Mat *in_stack_ffffffffffffff98;
  Mat local_58;
  int local_4;
  
  m = &local_58;
  (**(code **)(*in_RSI + 0x10))(m,in_RSI,*(undefined4 *)(in_RDI + 0xb8),1);
  Mat::operator=(in_stack_ffffffffffffff98,m);
  Mat::~Mat((Mat *)0x14391b);
  bVar1 = Mat::empty(m);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Bias::load_model(const ModelBin& mb)
{
    bias_data = mb.load(bias_data_size, 1);
    if (bias_data.empty())
        return -100;

    return 0;
}